

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_macro_operands_table
              (Dwarf_Macro_Context head,Dwarf_Half index,Dwarf_Half *opcode_number,
              Dwarf_Half *operand_count,Dwarf_Small **operand_array,Dwarf_Error *error)

{
  Dwarf_Macro_Forms_s *pDVar1;
  Dwarf_Debug local_50;
  Dwarf_Debug dbg;
  Dwarf_Macro_Forms_s *ops;
  Dwarf_Error *error_local;
  Dwarf_Small **operand_array_local;
  Dwarf_Half *operand_count_local;
  Dwarf_Half *opcode_number_local;
  Dwarf_Half index_local;
  Dwarf_Macro_Context head_local;
  
  local_50 = (Dwarf_Debug)0x0;
  if ((head == (Dwarf_Macro_Context)0x0) || (head->mc_sentinel != 0xada)) {
    if (head != (Dwarf_Macro_Context)0x0) {
      local_50 = head->mc_dbg;
    }
    _dwarf_error_string(local_50,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    head_local._4_4_ = 1;
  }
  else if (index < head->mc_opcode_count) {
    pDVar1 = head->mc_opcode_forms + (int)(uint)index;
    *opcode_number = (ushort)pDVar1->mf_code;
    *operand_count = (ushort)pDVar1->mf_formcount;
    *operand_array = pDVar1->mf_formbytes;
    head_local._4_4_ = 0;
  }
  else {
    _dwarf_error(head->mc_dbg,error,0x143);
    head_local._4_4_ = 1;
  }
  return head_local._4_4_;
}

Assistant:

int
dwarf_macro_operands_table(Dwarf_Macro_Context head,
    Dwarf_Half  index, /* 0 to opcode_count -1 */
    Dwarf_Half  *opcode_number,
    Dwarf_Half  *operand_count,
    const Dwarf_Small **operand_array,
    Dwarf_Error *error)
{
    struct Dwarf_Macro_Forms_s * ops = 0;
    Dwarf_Debug dbg = 0;

    CHECKNULLCONTEXT(head,dbg,error);
    dbg = head->mc_dbg;
    if (index >= head->mc_opcode_count) {
        _dwarf_error(dbg, error, DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    ops = head->mc_opcode_forms + index;
    *opcode_number = ops->mf_code;
    *operand_count = ops->mf_formcount;
    *operand_array = ops->mf_formbytes;
    return DW_DLV_OK;
}